

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O2

void ddSupportStep2(DdNode *f,int *support)

{
  if (((ulong)f->index != 0x7fffffff) && (((ulong)f->next & 1) == 0)) {
    support[f->index] = 1;
    ddSupportStep2((f->type).kids.T,support);
    ddSupportStep2((DdNode *)((ulong)(f->type).kids.E & 0xfffffffffffffffe),support);
    *(byte *)&f->next = *(byte *)&f->next ^ 1;
  }
  return;
}

Assistant:

void
ddSupportStep2(
  DdNode * f,
  int * support)
{
    if (cuddIsConstant(f) || Cudd_IsComplement(f->next)) {
    return;
    }

    support[f->index] = 1;
    ddSupportStep2(cuddT(f),support);
    ddSupportStep2(Cudd_Regular(cuddE(f)),support);
    /* Mark as visited. */
    f->next = Cudd_Not(f->next);
    return;

}